

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
::nosize_unchecked_emplace_at<std::pair<slang::parsing::TokenKind&&,slang::parsing::Token&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<slang::parsing::TokenKind_&&,_slang::parsing::Token_&&> *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  Token *pTVar3;
  ulong uVar4;
  group_type_pointer pgVar5;
  value_type_pointer ppVar6;
  Token *pTVar7;
  uint uVar8;
  ushort uVar9;
  byte bVar10;
  Info *pIVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  
  uVar4 = arrays_->groups_size_mask;
  pgVar5 = arrays_->groups_;
  lVar15 = 1;
  while( true ) {
    pgVar1 = pgVar5 + pos0;
    pgVar2 = pgVar5 + pos0;
    bVar10 = pgVar2->m[0xf].n;
    auVar16[0] = -(pgVar2->m[0].n == '\0');
    auVar16[1] = -(pgVar2->m[1].n == '\0');
    auVar16[2] = -(pgVar2->m[2].n == '\0');
    auVar16[3] = -(pgVar2->m[3].n == '\0');
    auVar16[4] = -(pgVar2->m[4].n == '\0');
    auVar16[5] = -(pgVar2->m[5].n == '\0');
    auVar16[6] = -(pgVar2->m[6].n == '\0');
    auVar16[7] = -(pgVar2->m[7].n == '\0');
    auVar16[8] = -(pgVar2->m[8].n == '\0');
    auVar16[9] = -(pgVar2->m[9].n == '\0');
    auVar16[10] = -(pgVar2->m[10].n == '\0');
    auVar16[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar16[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar16[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar16[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar16[0xf] = -(bVar10 == 0);
    uVar9 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe;
    if (uVar9 != 0) break;
    pgVar1->m[0xf].n = bVar10 | '\x01' << ((byte)hash & 7);
    pos0 = pos0 + lVar15 & uVar4;
    lVar15 = lVar15 + 1;
  }
  uVar8 = 0;
  if (uVar9 != 0) {
    for (; (uVar9 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
    }
  }
  ppVar6 = arrays_->elements_;
  ppVar6[pos0 * 0xf + (ulong)uVar8].first = *args->first;
  pTVar7 = args->second;
  uVar12 = pTVar7->field_0x2;
  NVar13.raw = (pTVar7->numFlags).raw;
  uVar14 = pTVar7->rawLen;
  pIVar11 = pTVar7->info;
  pTVar3 = &ppVar6[pos0 * 0xf + (ulong)uVar8].second;
  pTVar3->kind = pTVar7->kind;
  pTVar3->field_0x2 = uVar12;
  pTVar3->numFlags = (NumericTokenFlags)NVar13.raw;
  pTVar3->rawLen = uVar14;
  pTVar3->info = pIVar11;
  pgVar1->m[uVar8].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + ((uint)hash & 0xff));
  __return_storage_ptr__->pg = pgVar1;
  __return_storage_ptr__->n = uVar8;
  __return_storage_ptr__->p = ppVar6 + pos0 * 0xf + (ulong)uVar8;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }